

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhConsumeCellData(lhcell *pCell,_func_int_void_ptr_uint_void_ptr *xConsumer,void *pUserData)

{
  pgno local_70;
  pgno iOvfl;
  sxu32 nByte;
  int fix_offset;
  unqlite_page *pOvfl;
  sxu64 nData;
  lhash_kv_engine *pEngine;
  uchar *puStack_40;
  int rc;
  uchar *zPayload;
  uchar *zRaw;
  lhpage *pPage;
  void *pUserData_local;
  _func_int_void_ptr_uint_void_ptr *xConsumer_local;
  lhcell *pCell_local;
  
  zRaw = (uchar *)pCell->pPage;
  zPayload = ((lhpage *)zRaw)->pRaw->zData;
  puStack_40 = zPayload + pCell->iStart;
  pPage = (lhpage *)pUserData;
  pUserData_local = xConsumer;
  xConsumer_local = (_func_int_void_ptr_uint_void_ptr *)pCell;
  if (pCell->iOvfl == 0) {
    puStack_40 = puStack_40 + (pCell->nKey + 0x1a);
    pEngine._4_4_ = (*xConsumer)(puStack_40,(uint)pCell->nData,pUserData);
    if (pEngine._4_4_ != 0) {
      pEngine._4_4_ = -10;
    }
  }
  else {
    nData = (sxu64)((lhpage *)zRaw)->pHash;
    pOvfl = (unqlite_page *)pCell->nData;
    iOvfl._4_4_ = 0;
    local_70 = pCell->iDataPage;
    while ((local_70 != 0 && (pOvfl != (unqlite_page *)0x0))) {
      pEngine._4_4_ = (**(code **)(*(long *)nData + 0x10))(**(undefined8 **)nData,local_70,&nByte);
      if (pEngine._4_4_ != 0) {
        return pEngine._4_4_;
      }
      if (iOvfl._4_4_ == 0) {
        puStack_40 = (uchar *)(*_nByte + (long)(int)(uint)*(ushort *)(xConsumer_local + 0x38));
        iOvfl._0_4_ = *(int *)(nData + 0x110) - (uint)*(ushort *)(xConsumer_local + 0x38);
        iOvfl._4_4_ = 1;
      }
      else {
        puStack_40 = (uchar *)(*_nByte + 8);
        iOvfl._0_4_ = *(int *)(nData + 0x110) - 8;
      }
      if ((unqlite_page *)(ulong)(uint)iOvfl < pOvfl) {
        if ((uint)iOvfl != 0) {
          pEngine._4_4_ = (*(code *)pUserData_local)(puStack_40,(uint)iOvfl,pPage);
          if (pEngine._4_4_ != 0) {
            (**(code **)(*(long *)nData + 0x50))(_nByte);
            return -10;
          }
          pOvfl = (unqlite_page *)((long)pOvfl - (ulong)(uint)iOvfl);
        }
      }
      else {
        pEngine._4_4_ = (*(code *)pUserData_local)(puStack_40,(ulong)pOvfl & 0xffffffff,pPage);
        if (pEngine._4_4_ != 0) {
          (**(code **)(*(long *)nData + 0x50))(_nByte);
          return -10;
        }
        pOvfl = (unqlite_page *)0x0;
      }
      pEngine._4_4_ = 0;
      SyBigEndianUnpack64((uchar *)*_nByte,&local_70);
      (**(code **)(*(long *)nData + 0x50))(_nByte);
    }
    pEngine._4_4_ = 0;
  }
  return pEngine._4_4_;
}

Assistant:

static int lhConsumeCellData(
	lhcell *pCell, /* Target cell */
	int (*xConsumer)(const void *,unsigned int,void *), /* Data consumer callback */
	void *pUserData /* Last argument to xConsumer() */
	)
{
	lhpage *pPage = pCell->pPage;
	const unsigned char *zRaw = pPage->pRaw->zData;
	const unsigned char *zPayload;
	int rc;
	/* Point to the payload area */
	zPayload = &zRaw[pCell->iStart];
	if( pCell->iOvfl == 0 ){
		/* Best scenario, consume the data directly without any overflow page */
		zPayload += L_HASH_CELL_SZ + pCell->nKey;
		rc = xConsumer((const void *)zPayload,(sxu32)pCell->nData,pUserData);
		if( rc != UNQLITE_OK ){
			rc = UNQLITE_ABORT;
		}
	}else{
		lhash_kv_engine *pEngine = pPage->pHash;
		sxu64 nData = pCell->nData;
		unqlite_page *pOvfl;
		int fix_offset = 0;
		sxu32 nByte;
		pgno iOvfl;
		/* Overflow page where data is stored */
		iOvfl = pCell->iDataPage;
		for(;;){
			if( iOvfl == 0 || nData < 1 ){
				/* no more overflow page */
				break;
			}
			/* Point to the overflow page */
			rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,iOvfl,&pOvfl);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Point to the raw content */
			zPayload = pOvfl->zData;
			if( !fix_offset ){
				/* Point to the data */
				zPayload += pCell->iDataOfft;
				nByte = pEngine->iPageSize - pCell->iDataOfft;
				fix_offset = 1;
			}else{
				zPayload += 8;
				/* Total usable bytes in an overflow page */
				nByte = L_HASH_OVERFLOW_SIZE(pEngine->iPageSize);
			}
			/* Consume the data */
			if( nData <= (sxu64)nByte ){
				rc = xConsumer((const void *)zPayload,(unsigned int)nData,pUserData);
				if( rc != UNQLITE_OK ){
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_ABORT;
				}
				nData = 0;
			}else{
				if( nByte > 0 ){
					rc = xConsumer((const void *)zPayload,nByte,pUserData);
					if( rc != UNQLITE_OK ){
						pEngine->pIo->xPageUnref(pOvfl);
						return UNQLITE_ABORT;
					}
					nData -= nByte;
				}
			}
			/* Next overflow page in the chain */
			SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
			/* Unref the page */
			pEngine->pIo->xPageUnref(pOvfl);
		}
		rc = UNQLITE_OK;
	}
	return rc;
}